

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeLocalSet(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  mapped_type *this_00;
  Expression *value_00;
  value_type_conflict3 *pvVar2;
  Expression *value;
  mapped_type *locals;
  Type local_30;
  Type valueType;
  bool tee;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  valueType.id._0_4_ = 0;
  this_local = (TranslateToFuzzReader *)type.id;
  valueType.id._7_1_ = Type::operator!=((Type *)&this_local,(BasicType *)&valueType);
  Type::Type(&local_30);
  if ((valueType.id._7_1_ & 1) == 0) {
    local_30 = getConcreteType(this);
  }
  else {
    local_30.id = (uintptr_t)this_local;
  }
  this_00 = std::
            unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->funcContext->typeLocals,&local_30);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(this_00);
  if (bVar1) {
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    value_00 = make(this,local_30);
    if ((valueType.id._7_1_ & 1) == 0) {
      pvVar2 = pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this,this_00);
      type_local.id = (uintptr_t)Builder::makeLocalSet(&this->builder,*pvVar2,value_00);
    }
    else {
      pvVar2 = pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this,this_00);
      type_local.id = (uintptr_t)Builder::makeLocalTee(&this->builder,*pvVar2,value_00,local_30);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeLocalSet(Type type) {
  bool tee = type != Type::none;
  Type valueType;
  if (tee) {
    valueType = type;
  } else {
    valueType = getConcreteType();
  }
  auto& locals = funcContext->typeLocals[valueType];
  if (locals.empty()) {
    return makeTrivial(type);
  }
  auto* value = make(valueType);
  if (tee) {
    return builder.makeLocalTee(pick(locals), value, valueType);
  } else {
    return builder.makeLocalSet(pick(locals), value);
  }
}